

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getBaseTwist(KinDynComputations *this,Span<double,__1L> base_velocity)

{
  index_type iVar1;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_RSI;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_RDI;
  bool bVar2;
  bool ok;
  int expected_twist_size;
  KinDynComputations *in_stack_ffffffffffffff68;
  storage_type<iDynTree::details::extent_type<_1L>_> in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar4 = 6;
  iVar1 = Span<double,_-1L>::size((Span<double,__1L> *)0x1c9d43);
  bVar2 = iVar1 == 6;
  uVar3 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffd8);
  if (bVar2) {
    getBaseTwist(in_stack_ffffffffffffff68);
    toEigen((SpatialMotionVector *)CONCAT44(uVar4,uVar3));
    toEigen((Span<double,__1L>)in_stack_ffffffffffffff70);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=(in_RSI,in_RDI);
  }
  else {
    iDynTree::reportError("KinDynComputations","getRobotState","Wrong size in input base_velocity");
  }
  return bVar2;
}

Assistant:

bool KinDynComputations::getBaseTwist(Span<double> base_velocity) const
{
    constexpr int expected_twist_size = 6;
    bool ok = base_velocity.size() == expected_twist_size;
    if( !ok )
    {
        reportError("KinDynComputations","getRobotState","Wrong size in input base_velocity");
        return false;
    }

    toEigen(base_velocity) = toEigen(getBaseTwist());
    return true;
}